

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

QMenuBar * __thiscall QMdiSubWindowPrivate::menuBar(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  ViewMode VVar2;
  QMdiArea *this_01;
  QMainWindow *this_02;
  QMenuBar *pQVar3;
  
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar1 = QWidget::isMaximized(this_00);
  if ((bVar1) && (bVar1 = drawTitleBarWhenMaximized(this), !bVar1)) {
    this_01 = QMdiSubWindow::mdiArea((QMdiSubWindow *)this_00);
    if ((this_01 != (QMdiArea *)0x0) && (VVar2 = QMdiArea::viewMode(this_01), VVar2 == TabbedView))
    {
      return (QMenuBar *)0x0;
    }
    QWidget::window(this_00);
    this_02 = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    if (this_02 != (QMainWindow *)0x0) {
      pQVar3 = QMainWindow::menuBar(this_02);
      return pQVar3;
    }
  }
  return (QMenuBar *)0x0;
}

Assistant:

QMenuBar *QMdiSubWindowPrivate::menuBar() const
{
#if !QT_CONFIG(mainwindow)
    return nullptr;
#else
    Q_Q(const QMdiSubWindow);
    if (!q->isMaximized() || drawTitleBarWhenMaximized() || isChildOfTabbedQMdiArea(q))
        return nullptr;

    if (QMainWindow *mainWindow = qobject_cast<QMainWindow *>(q->window()))
        return mainWindow->menuBar();

    return nullptr;
#endif
}